

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

string * GdlRule::EngineCodeDebugString_abi_cxx11_(int op)

{
  undefined4 in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  allocator *paVar1;
  char *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd98;
  string local_80 [34];
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Nop",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushByte",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushByteU",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushShort",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushShortU",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushLong",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Add",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Sub",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Mul",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Div",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Min",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Max",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Neg",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Trunc8",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Trunc16",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Cond",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"And",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Or",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Not",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Equal",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"NotEq",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Less",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Gtr",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"LessEq",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"GtrEq",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Next",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"NextN",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"CopyNext",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case 0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutGlyph(V1&2)",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    break;
  case 0x1d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutSubs(V1&2)",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    break;
  case 0x1e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutCopy",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case 0x1f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Insert",&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    break;
  case 0x20:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Delete",&local_43);
    std::allocator<char>::~allocator((allocator<char> *)&local_43);
    break;
  case 0x21:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Assoc",&local_44);
    std::allocator<char>::~allocator((allocator<char> *)&local_44);
    break;
  case 0x22:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"CntxtItem",&local_45);
    std::allocator<char>::~allocator((allocator<char> *)&local_45);
    break;
  case 0x23:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"AttrSet",&local_46);
    std::allocator<char>::~allocator((allocator<char> *)&local_46);
    break;
  case 0x24:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"AttrAdd",&local_47);
    std::allocator<char>::~allocator((allocator<char> *)&local_47);
    break;
  case 0x25:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"AttrSub",&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_48);
    break;
  case 0x26:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"AttrSetSlot",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    break;
  case 0x27:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"IAttrSetSlot",&local_4a);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
    break;
  case 0x28:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushSlotAttr",&local_4b);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b);
    break;
  case 0x29:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushGlyphAttr(V1&2)",&local_4e);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e);
    break;
  case 0x2a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushGlyphMetric",&local_4f);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f);
    break;
  case 0x2b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushFeat",&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_50);
    break;
  case 0x2c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushAttToGlyphAttr(V1&2)",&local_52);
    std::allocator<char>::~allocator((allocator<char> *)&local_52);
    break;
  case 0x2d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushAttToGlyphMetric",&local_53);
    std::allocator<char>::~allocator((allocator<char> *)&local_53);
    break;
  case 0x2e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushISlotAttr",&local_4c);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c);
    break;
  case 0x2f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushIGlyphAttr",&local_54);
    std::allocator<char>::~allocator((allocator<char> *)&local_54);
    break;
  case 0x30:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PopRet",&local_56);
    std::allocator<char>::~allocator((allocator<char> *)&local_56);
    break;
  case 0x31:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"RetZero",&local_57);
    std::allocator<char>::~allocator((allocator<char> *)&local_57);
    break;
  case 0x32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"RetTrue",&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_58);
    break;
  case 0x33:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"IAttrSet",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    break;
  case 0x34:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"IAttrAdd",&local_5a);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a);
    break;
  case 0x35:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"IAttrSub",&local_5b);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b);
    break;
  case 0x36:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushProcState",&local_5c);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c);
    break;
  case 0x37:
    paVar1 = &local_55;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushVersion",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_55);
    break;
  case 0x38:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutSubs",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    break;
  case 0x39:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutSubs2",&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    break;
  case 0x3a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutSubs3",&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_40);
    break;
  case 0x3b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PutGlyph",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case 0x3c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushGlyphAttr",&local_4d);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d);
    break;
  case 0x3d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"PushAttToGlyphAttr",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    break;
  case 0x3e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"BitAnd",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0x3f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"BitOr",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0x40:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"BitNot",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0x41:
    paVar1 = &local_5d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"SetBits",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d);
    break;
  case 0x42:
    paVar1 = &local_5e;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"FeatSet",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e);
    break;
  default:
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    std::__cxx11::string::~string(local_80);
  }
  return in_RDI;
}

Assistant:

std::string GdlRule::EngineCodeDebugString(int op)
{
	switch (op)
	{
	case kopNop:					return "Nop";
	case kopPushByte:				return "PushByte";
	case kopPushByteU:				return "PushByteU";
	case kopPushShort:				return "PushShort";
	case kopPushShortU:				return "PushShortU";
	case kopPushLong:				return "PushLong";
	case kopAdd:					return "Add";
	case kopSub:					return "Sub";
	case kopMul:					return "Mul";
	case kopDiv:					return "Div";
	case kopMin:					return "Min";
	case kopMax:					return "Max";
	case kopNeg:					return "Neg";
	case kopTrunc8:					return "Trunc8";
	case kopTrunc16:				return "Trunc16";
	case kopCond:					return "Cond";
	case kopAnd:					return "And";
	case kopOr:						return "Or";
	case kopNot:					return "Not";
	case kopBitAnd:					return "BitAnd";
	case kopBitOr:					return "BitOr";
	case kopBitNot:					return "BitNot";
	case kopEqual:					return "Equal";
	case kopNotEq:					return "NotEq";
	case kopLess:					return "Less";
	case kopGtr:					return "Gtr";
	case kopLessEq:					return "LessEq";
	case kopGtrEq:					return "GtrEq";
	case kopNext:					return "Next";
	case kopNextN:					return "NextN";
	case kopCopyNext:				return "CopyNext";
	case kopPutGlyph:				return "PutGlyph";
	case kopPutGlyphV1_2:			return "PutGlyph(V1&2)";
	case kopPutSubsV1_2:			return "PutSubs(V1&2)";
	case kopPutSubs:				return "PutSubs";
	case kopPutSubs2:				return "PutSubs2";
	case kopPutSubs3:				return "PutSubs3";
	case kopPutCopy:				return "PutCopy";
	case kopInsert:					return "Insert";
	case kopDelete:					return "Delete";
	case kopAssoc:					return "Assoc";
	case kopCntxtItem:				return "CntxtItem";
	case kopAttrSet:				return "AttrSet";
	case kopAttrAdd:				return "AttrAdd";
	case kopAttrSub:				return "AttrSub";
//	case kopAttrBitAnd:				return "AttrBitAnd";
//	case kopAttrBitOr:				return "AttrBitOr";
	case kopAttrSetSlot:			return "AttrSetSlot";
	case kopIAttrSetSlot:			return "IAttrSetSlot";
	case kopPushSlotAttr:			return "PushSlotAttr";
	case kopPushISlotAttr:			return "PushISlotAttr";
	case kopPushGlyphAttr:			return "PushGlyphAttr";
	case kopPushGlyphAttrV1_2:		return "PushGlyphAttr(V1&2)";
	case kopPushGlyphMetric:		return "PushGlyphMetric";
	case kopPushFeat:				return "PushFeat";
	case kopPushAttToGlyphAttr:		return "PushAttToGlyphAttr";
	case kopPushAttToGAttrV1_2:		return "PushAttToGlyphAttr(V1&2)";
	case kopPushAttToGlyphMetric:	return "PushAttToGlyphMetric";
	case kopPushIGlyphAttr:			return "PushIGlyphAttr";
	case kopPushVersion:			return "PushVersion";
	case kopPopRet:					return "PopRet";
	case kopRetZero:				return "RetZero";
	case kopRetTrue:				return "RetTrue";
	case kopIAttrSet:				return "IAttrSet";
	case kopIAttrAdd:				return "IAttrAdd";
	case kopIAttrSub:				return "IAttrSub";
//	case kopIAttrBitAnd:			return "IAttrBitAnd";
//	case kopIAttrBitOr:				return "IAttrBitOr";
	case kopPushProcState:			return "PushProcState";
	case kopSetBits:				return "SetBits";
	case kopFeatSet:				return "FeatSet";
	default:
		Assert(false);
		return "bad-engine-op-" + std::to_string(op);
	}
}